

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_Touch(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret
                   ,int numret)

{
  bool bVar1;
  DObject *this;
  char *pcVar2;
  DObject *this_00;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_00431a3d;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00431a24:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00431a3d:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x5d3,"int AF_AActor_Touch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (DObject *)0x0) goto LAB_004319ab;
    bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00431a3d;
    }
  }
  else {
    if (this != (DObject *)0x0) goto LAB_00431a24;
LAB_004319ab:
    this = (DObject *)0x0;
  }
  if (numparam == 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_00431a5c;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_00431a2d:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00431a5c;
  }
  this_00 = (DObject *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (this_00 == (DObject *)0x0) goto LAB_004319d4;
  }
  else {
    if (this_00 != (DObject *)0x0) goto LAB_00431a2d;
LAB_004319d4:
    NullParam("\"toucher\"");
    this_00 = (DObject *)param[1].field_0.field_1.a;
    if (this_00 == (DObject *)0x0) {
      this_00 = (DObject *)0x0;
      goto LAB_00431a08;
    }
  }
  bVar1 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
  if (!bVar1) {
    pcVar2 = "toucher == NULL || toucher->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_00431a5c:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x5d4,"int AF_AActor_Touch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_00431a08:
  (*this->_vptr_DObject[0x13])(this,this_00);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Touch)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(toucher, AActor);
	self->Touch(toucher);
	return 0;
}